

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::detail::MultipartFormDataParser::start_with
          (MultipartFormDataParser *this,string *a,size_t spos,size_t epos,string *b)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  if (epos - spos < b->_M_string_length) {
    return false;
  }
  uVar3 = 0;
  do {
    bVar4 = b->_M_string_length == uVar3;
    if (bVar4) {
      return bVar4;
    }
    lVar2 = uVar3 + spos;
    pcVar1 = (b->_M_dataplus)._M_p + uVar3;
    uVar3 = uVar3 + 1;
  } while ((a->_M_dataplus)._M_p[lVar2] == *pcVar1);
  return bVar4;
}

Assistant:

bool start_with(const std::string &a, size_t spos, size_t epos,
                  const std::string &b) const {
    if (epos - spos < b.size()) { return false; }
    for (size_t i = 0; i < b.size(); i++) {
      if (a[i + spos] != b[i]) { return false; }
    }
    return true;
  }